

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  ulong uVar2;
  ushort uVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  ValueHolder VVar6;
  undefined8 *puVar7;
  Value *pVVar8;
  ValueHolder *pVVar9;
  int iVar10;
  undefined8 uVar11;
  ulong uVar12;
  Value outputJSON;
  string stg;
  string myin;
  Value input_json;
  Reader reader;
  ValueHolder local_228;
  ushort local_220;
  undefined6 uStack_21e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined8 local_208;
  string local_200;
  long *local_1e0;
  undefined8 local_1d8;
  long local_1d0;
  undefined8 uStack_1c8;
  Value local_1c0;
  ValueHolder local_198;
  ushort local_190;
  ValueHolder local_180;
  ValueHolder local_178;
  ValueHolder local_170;
  ushort local_168;
  ValueHolder local_158;
  ValueHolder local_150;
  undefined1 local_148 [160];
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [3];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  iVar10 = 5;
  do {
    local_148._0_8_ = (pointer)0x0;
    local_148._8_8_ = (pointer)0x0;
    local_148._16_8_ = (pointer)0x0;
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&all_card_abi_cxx11_,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  local_1c0._8_2_ = local_1c0._8_2_ & 0xfe00;
  local_1c0.comments_ = (CommentInfo *)0x0;
  local_1c0.start_ = 0;
  local_1c0.limit_ = 0;
  Json::Reader::Reader((Reader *)local_148);
  local_228.string_ = (char *)&local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "{\"requests\":[\"0 2 1\",\"1 0 0 0 0 F3 T6 W5 B7 W2 T7 W1 B2 W9 T3 W4 W7 T5\",\"3 0 DRAW\",\"3 0 PLAY J2\",\"3 1 DRAW\",\"3 1 PLAY F3\",\"2 B3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W8\",\"3 0 DRAW\",\"3 0 PLAY B8\",\"3 3 PENG B2\",\"3 0 DRAW\",\"3 0 PLAY B4\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"3 2 CHI B3 W1\",\"3 3 DRAW\",\"3 3 PLAY B1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY B1\",\"2 F2\",\"3 2 PLAY F2\",\"3 3 DRAW\",\"3 3 PLAY J1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY J1\",\"2 W1\",\"3 2 PLAY W1\",\"3 3 DRAW\",\"3 3 PLAY T5\",\"3 0 DRAW\",\"3 0 PLAY B9\",\"3 1 DRAW\",\"3 1 PLAY J2\",\"2 F1\",\"3 2 PLAY F1\",\"3 3 DRAW\",\"3 3 PLAY T8\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 CHI B6 B9\",\"2 W4\",\"3 2 PLAY B7\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B3\",\"3 2 PLAY B3\",\"3 3 DRAW\",\"3 3 PLAY J2\",\"3 0 DRAW\",\"3 0 PLAY W7\",\"3 1 CHI W7 J3\",\"2 W5\",\"3 2 PLAY W7\",\"3 3 DRAW\",\"3 3 PLAY T3\",\"3 0 DRAW\",\"3 0 PLAY T9\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B2\",\"3 2 PLAY B2\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T3\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 W3\",\"3 2 PLAY W3\",\"3 3 CHI W2 W5\",\"3 2 PENG W2\",\"3 3 DRAW\",\"3 3 PLAY F3\",\"3 0 DRAW\",\"3 0 PLAY T2\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"2 J3\",\"3 2 PLAY J3\",\"3 3 DRAW\",\"3 3 PLAY T1\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY F1\",\"3 3 PENG W5\",\"3 0 DRAW\",\"3 0 PLAY W8\",\"3 1 DRAW\",\"3 1 PLAY B9\",\"2 F3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY T2\",\"2 W6\",\"3 2 PLAY T3\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY B3\",\"2 B8\",\"3 2 PLAY W6\",\"3 3 DRAW\",\"3 3 PLAY W7\",\"3 0 DRAW\",\"3 0 PLAY F2\",\"3 1 DRAW\",\"3 1 PLAY W9\",\"2 W4\",\"3 2 PLAY W9\",\"3 3 DRAW\",\"3 3 PLAY B9\",\"3 0 DRAW\",\"3 0 PLAY T8\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 B3\",\"3 2 PLAY T5\",\"3 3 DRAW\",\"3 3 PLAY J3\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY B6\",\"2 B2\",\"3 2 PLAY B8\",\"3 3 DRAW\",\"3 3 PLAY T2\",\"3 0 DRAW\",\"3 0 PLAY J1\",\"3 1 DRAW\",\"3 1 PLAY T9\",\"2 T6\",\"3 2 PLAY T7\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F2\"],\"responses\":[\"PASS\",\"PASS\",\"PASS\",\"PASS"
             ,"");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"CHI B3 W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W3\",\"PASS\",\"PENG W2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY J3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W6\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W9\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T5\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B8\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\"]}"
             ,"");
  uVar2 = local_200._M_string_length + CONCAT62(uStack_21e,local_220);
  uVar11 = 0xf;
  if (local_228 != &local_218) {
    uVar11 = local_218._M_allocated_capacity;
  }
  if ((ulong)uVar11 < uVar2) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      uVar12 = CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                        local_200.field_2._M_local_buf[0]);
    }
    if (uVar2 <= uVar12) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,local_228.uint_);
      goto LAB_0011e883;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_228.int_,(ulong)local_200._M_dataplus._M_p);
LAB_0011e883:
  local_1e0 = &local_1d0;
  plVar1 = puVar7 + 2;
  if ((long *)*puVar7 == plVar1) {
    local_1d0 = *plVar1;
    uStack_1c8 = puVar7[3];
  }
  else {
    local_1d0 = *plVar1;
    local_1e0 = (long *)*puVar7;
  }
  local_1d8 = puVar7[1];
  *puVar7 = plVar1;
  puVar7[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                             local_200.field_2._M_local_buf[0]) + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&local_a8);
  Json::Reader::parse((Reader *)local_148,local_a8._M_p,local_a8._M_p + local_a0,&local_1c0,true);
  pVVar8 = Json::Value::resolveReference(&local_1c0,"responses",false);
  turn_id = Json::Value::size(pVVar8);
  if (0 < turn_id) {
    iVar10 = 0;
    do {
      pVVar8 = Json::Value::resolveReference(&local_1c0,"requests",false);
      pVVar8 = Json::Value::operator[](pVVar8,iVar10);
      Json::Value::asString_abi_cxx11_((string *)&local_228,pVVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &request_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228);
      if (local_228 != &local_218) {
        operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
      }
      pVVar8 = Json::Value::resolveReference(&local_1c0,"responses",false);
      pVVar8 = Json::Value::operator[](pVVar8,iVar10);
      Json::Value::asString_abi_cxx11_((string *)&local_228,pVVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &response_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228);
      if (local_228 != &local_218) {
        operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < turn_id);
  }
  pVVar8 = Json::Value::resolveReference(&local_1c0,"requests",false);
  pVVar8 = Json::Value::operator[](pVVar8,turn_id);
  Json::Value::asString_abi_cxx11_((string *)&local_228,pVVar8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &request_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
  }
  if (turn_id < 2) {
    local_228.string_ = (char *)&local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"PASS","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &response_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228);
  }
  else {
    initCondition_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&stmp_abi_cxx11_,(string *)&local_228.bool_);
    if (local_228 != &local_218) {
      operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&current_card_abi_cxx11_);
    std::ios::clear((int)*(undefined8 *)(str_in_abi_cxx11_ + -0x18) + 0x135478);
    std::__cxx11::stringbuf::str((string *)&DAT_00135488);
    std::istream::operator>>((istream *)&str_in_abi_cxx11_,&itmp);
    if (itmp == 3) {
      iVar10 = std::__cxx11::string::compare((char *)&stmp_abi_cxx11_);
      if (iVar10 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)str_out_abi_cxx11_,"PASS",4);
      }
      else {
        responseOutTurn();
      }
    }
    else if (itmp == 2) {
      playCard();
    }
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &response_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
  }
  local_220 = local_220 & 0xfe00;
  local_218._M_allocated_capacity = 0;
  local_218._8_8_ = 0;
  local_208 = 0;
  Json::Value::Value((Value *)&local_170,
                     response_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + turn_id);
  pVVar9 = &Json::Value::resolveReference((Value *)&local_228,"response",false)->value_;
  uVar3 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar3 & 0xff00 | local_168 & 0xff;
  VVar4 = *pVVar9;
  *pVVar9 = local_170;
  *(ushort *)(pVVar9 + 1) = uVar3 & 0xfe00 | local_168 & 0xff | local_168 & 0x100;
  local_168 = local_168 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100;
  VVar5 = pVVar9[3];
  pVVar9[3] = local_158;
  VVar6 = pVVar9[4];
  pVVar9[4] = local_150;
  local_170 = VVar4;
  local_158 = VVar5;
  local_150 = VVar6;
  Json::Value::~Value((Value *)&local_170);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  if (current_strategy - 1U < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_200,0,(char *)0x0,
               (ulong)(&DAT_001285dc + *(int *)(&DAT_001285dc + (ulong)(current_strategy - 1U) * 4))
              );
  }
  Json::Value::Value((Value *)&local_198,&local_200);
  pVVar9 = &Json::Value::resolveReference((Value *)&local_228,"debug",false)->value_;
  uVar3 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar3 & 0xff00 | local_190 & 0xff;
  VVar4 = *pVVar9;
  *pVVar9 = local_198;
  *(ushort *)(pVVar9 + 1) = uVar3 & 0xfe00 | local_190 & 0xff | local_190 & 0x100;
  local_190 = local_190 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100;
  VVar5 = pVVar9[3];
  pVVar9[3] = local_180;
  VVar6 = pVVar9[4];
  pVVar9[4] = local_178;
  local_198 = VVar4;
  local_180 = VVar5;
  local_178 = VVar6;
  Json::Value::~Value((Value *)&local_198);
  Json::operator<<((ostream *)&std::cout,(Value *)&local_228);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                             local_200.field_2._M_local_buf[0]) + 1);
  }
  Json::Value::~Value((Value *)&local_228);
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != local_50) {
    operator_delete(local_60._M_p,local_50[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != local_98) {
    operator_delete(local_a8._M_p,local_98[0]._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
             (local_148 + 0x50));
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_148);
  Json::Value::~Value(&local_1c0);
  return 0;
}

Assistant:

int main() {
    //初始化all_card 0-3是四个玩家，4是桌上的牌
    for (int i = 0; i < 5; i++) {
        vector<string> vtmp;
        all_card.push_back(vtmp);
    }

    //
    //Json交互的输入（删掉了普通交互）
    Json::Value input_json;
#ifdef _BOTZONE_ONLINE
    cin >> input_json;
#else
    //==========debug============
    Json::Reader reader;
    string myin = string("{\"requests\":[\"0 2 1\",\"1 0 0 0 0 F3 T6 W5 B7 W2 T7 W1 B2 W9 T3 W4 W7 T5\",\"3 0 DRAW\",\"3 0 PLAY J2\",\"3 1 DRAW\",\"3 1 PLAY F3\",\"2 B3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W8\",\"3 0 DRAW\",\"3 0 PLAY B8\",\"3 3 PENG B2\",\"3 0 DRAW\",\"3 0 PLAY B4\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"3 2 CHI B3 W1\",\"3 3 DRAW\",\"3 3 PLAY B1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY B1\",\"2 F2\",\"3 2 PLAY F2\",\"3 3 DRAW\",\"3 3 PLAY J1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY J1\",\"2 W1\",\"3 2 PLAY W1\",\"3 3 DRAW\",\"3 3 PLAY T5\",\"3 0 DRAW\",\"3 0 PLAY B9\",\"3 1 DRAW\",\"3 1 PLAY J2\",\"2 F1\",\"3 2 PLAY F1\",\"3 3 DRAW\",\"3 3 PLAY T8\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 CHI B6 B9\",\"2 W4\",\"3 2 PLAY B7\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B3\",\"3 2 PLAY B3\",\"3 3 DRAW\",\"3 3 PLAY J2\",\"3 0 DRAW\",\"3 0 PLAY W7\",\"3 1 CHI W7 J3\",\"2 W5\",\"3 2 PLAY W7\",\"3 3 DRAW\",\"3 3 PLAY T3\",\"3 0 DRAW\",\"3 0 PLAY T9\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B2\",\"3 2 PLAY B2\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T3\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 W3\",\"3 2 PLAY W3\",\"3 3 CHI W2 W5\",\"3 2 PENG W2\",\"3 3 DRAW\",\"3 3 PLAY F3\",\"3 0 DRAW\",\"3 0 PLAY T2\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"2 J3\",\"3 2 PLAY J3\",\"3 3 DRAW\",\"3 3 PLAY T1\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY F1\",\"3 3 PENG W5\",\"3 0 DRAW\",\"3 0 PLAY W8\",\"3 1 DRAW\",\"3 1 PLAY B9\",\"2 F3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY T2\",\"2 W6\",\"3 2 PLAY T3\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY B3\",\"2 B8\",\"3 2 PLAY W6\",\"3 3 DRAW\",\"3 3 PLAY W7\",\"3 0 DRAW\",\"3 0 PLAY F2\",\"3 1 DRAW\",\"3 1 PLAY W9\",\"2 W4\",\"3 2 PLAY W9\",\"3 3 DRAW\",\"3 3 PLAY B9\",\"3 0 DRAW\",\"3 0 PLAY T8\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 B3\",\"3 2 PLAY T5\",\"3 3 DRAW\",\"3 3 PLAY J3\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY B6\",\"2 B2\",\"3 2 PLAY B8\",\"3 3 DRAW\",\"3 3 PLAY T2\",\"3 0 DRAW\",\"3 0 PLAY J1\",\"3 1 DRAW\",\"3 1 PLAY T9\",\"2 T6\",\"3 2 PLAY T7\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F2\"],\"responses\":[\"PASS\",\"PASS\",\"PASS\",\"PASS") + string("\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"CHI B3 W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W3\",\"PASS\",\"PENG W2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY J3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W6\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W9\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T5\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B8\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\"]}");
    reader.parse(myin, input_json);
    //==========debug============
#endif
    //当前回合的下标（即总共回合数量-1）
    turn_id = input_json["responses"].size();
    //读取交互信息，存入request和response
    for (int i = 0; i < turn_id; i++) {
        request.push_back(input_json["requests"][i].asString());
        response.push_back(input_json["responses"][i].asString());
    }
    request.push_back(input_json["requests"][turn_id].asString());

    if (turn_id < 2) { //如果当前回合数是1或0
        response.push_back("PASS");
    }
    else { //如果这局itmp是2，stmp就是我在这局摸到的牌，如果这局itmp是3，只有别的玩家出牌了才会返回出的是什么牌，其他都返回“Fail”
        stmp = initCondition();
        //stmp = "Fail";//debug用
        current_card = stmp;
        str_in.clear();
        str_in.str(request[turn_id]);
        str_in >> itmp;
        //for (int i = 0; i < all_card[my_player_id].size(); i++)
        //	str_out << all_card[my_player_id][i] << " ";
        if (itmp == 2) { //到我的时候，这时stmp就是牌的信息
            playCard();
        }
            //3 2 PLAY T1
        else if (itmp == 3) {
            if (stmp != "Fail") {
                //bugang
                //if (find(peng.begin(), peng.end(), stmp) != peng.end()) {
                //	doBUGANG();
                //}
                //else{
                //str_out << stmp << " ";
                //str_out << "PASS";
                responseOutTurn();
                //}
            }
            else
                str_out << "PASS";
        }
        response.push_back(str_out.str());
    }

    //Json交互的输出（删掉了普通交互）
    Json::Value outputJSON;
    outputJSON["response"] = response[turn_id];

    //========debug==========
    string stg;
    if (current_strategy == STG_PENG_PENG) { stg = "碰碰胡";}
    else if (current_strategy == STG_HUN_YI_SE) { stg = "混一色"; }
    else if (current_strategy == STG_QUAN_QIU_REN) { stg = "全求人"; }
    else if (current_strategy == STG_WU_MEN) { stg = "五门齐"; }
    outputJSON["debug"] = stg;
    //========debug==========

    cout << outputJSON << endl;
    return 0;
}